

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O0

void __thiscall cmInstallExportGenerator::GenerateScript(cmInstallExportGenerator *this,ostream *os)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
  *this_01;
  ostream *poVar2;
  string *psVar3;
  pointer pcVar4;
  char *mainFile;
  ulong uVar5;
  reference config;
  string *c;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_268;
  cmAlphaNum local_248;
  cmAlphaNum local_218;
  string local_1e8;
  Status local_1c8;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream e;
  ostream *os_local;
  cmInstallExportGenerator *this_local;
  
  this_01 = cmExportSet::GetTargetExports(this->ExportSet);
  bVar1 = std::
          vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
          ::empty(this_01);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar2 = std::operator<<((ostream *)local_190,"INSTALL(EXPORT) given unknown export \"");
    psVar3 = cmExportSet::GetName_abi_cxx11_(this->ExportSet);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    std::operator<<(poVar2,"\"");
    std::__cxx11::ostringstream::str();
    cmSystemTools::Error(&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  else {
    ComputeTempDir(this);
    local_1c8 = cmsys::SystemTools::MakeDirectory(&this->TempDir,(mode_t *)0x0);
    cmAlphaNum::cmAlphaNum(&local_218,&this->TempDir);
    cmAlphaNum::cmAlphaNum(&local_248,'/');
    cmStrCat<std::__cxx11::string>(&local_1e8,&local_218,&local_248,&this->FileName);
    std::__cxx11::string::operator=((string *)&this->MainImportFile,(string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    pcVar4 = std::
             unique_ptr<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
             ::operator->(&this->EFGen);
    mainFile = (char *)std::__cxx11::string::c_str();
    cmExportFileGenerator::SetExportFile(&pcVar4->super_cmExportFileGenerator,mainFile);
    pcVar4 = std::
             unique_ptr<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
             ::operator->(&this->EFGen);
    cmExportFileGenerator::SetNamespace(&pcVar4->super_cmExportFileGenerator,&this->Namespace);
    pcVar4 = std::
             unique_ptr<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
             ::operator->(&this->EFGen);
    cmExportFileGenerator::SetExportOld
              (&pcVar4->super_cmExportFileGenerator,(bool)(this->ExportOld & 1));
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((this->super_cmInstallGenerator).super_cmScriptGenerator.ConfigurationTypes);
    if (bVar1) {
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        pcVar4 = std::
                 unique_ptr<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
                 ::operator->(&this->EFGen);
        cmExportFileGenerator::AddConfiguration
                  (&pcVar4->super_cmExportFileGenerator,
                   &(this->super_cmInstallGenerator).super_cmScriptGenerator.ConfigurationName);
      }
      else {
        pcVar4 = std::
                 unique_ptr<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
                 ::operator->(&this->EFGen);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_268,"",(allocator<char> *)((long)&__range2 + 7));
        cmExportFileGenerator::AddConfiguration(&pcVar4->super_cmExportFileGenerator,&local_268);
        std::__cxx11::string::~string((string *)&local_268);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
      }
    }
    else {
      this_00 = (this->super_cmInstallGenerator).super_cmScriptGenerator.ConfigurationTypes;
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this_00);
      c = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&c), bVar1) {
        config = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
        pcVar4 = std::
                 unique_ptr<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
                 ::operator->(&this->EFGen);
        cmExportFileGenerator::AddConfiguration(&pcVar4->super_cmExportFileGenerator,config);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
    }
    pcVar4 = std::
             unique_ptr<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
             ::operator->(&this->EFGen);
    cmExportFileGenerator::GenerateImportFile(&pcVar4->super_cmExportFileGenerator);
    cmInstallGenerator::GenerateScript(&this->super_cmInstallGenerator,os);
  }
  return;
}

Assistant:

void cmInstallExportGenerator::GenerateScript(std::ostream& os)
{
  // Skip empty sets.
  if (this->ExportSet->GetTargetExports().empty()) {
    std::ostringstream e;
    e << "INSTALL(EXPORT) given unknown export \""
      << this->ExportSet->GetName() << "\"";
    cmSystemTools::Error(e.str());
    return;
  }

  // Create the temporary directory in which to store the files.
  this->ComputeTempDir();
  cmSystemTools::MakeDirectory(this->TempDir);

  // Construct a temporary location for the file.
  this->MainImportFile = cmStrCat(this->TempDir, '/', this->FileName);

  // Generate the import file for this export set.
  this->EFGen->SetExportFile(this->MainImportFile.c_str());
  this->EFGen->SetNamespace(this->Namespace);
  this->EFGen->SetExportOld(this->ExportOld);
  if (this->ConfigurationTypes->empty()) {
    if (!this->ConfigurationName.empty()) {
      this->EFGen->AddConfiguration(this->ConfigurationName);
    } else {
      this->EFGen->AddConfiguration("");
    }
  } else {
    for (std::string const& c : *this->ConfigurationTypes) {
      this->EFGen->AddConfiguration(c);
    }
  }
  this->EFGen->GenerateImportFile();

  // Perform the main install script generation.
  this->cmInstallGenerator::GenerateScript(os);
}